

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFExporter::ExportMaterials(glTFExporter *this)

{
  undefined8 uVar1;
  aiReturn aVar2;
  char *pcVar3;
  element_type *peVar4;
  Material *pMVar5;
  Ref<glTF::Material> RVar6;
  bool local_51d;
  undefined1 local_480 [8];
  Ref<glTF::Material> m;
  undefined1 local_440 [8];
  string name;
  aiMaterial *mat;
  uint i;
  aiString aiName;
  glTFExporter *this_local;
  
  aiName.data._1016_8_ = this;
  aiString::aiString((aiString *)((long)&mat + 4));
  for (mat._0_4_ = 0; (uint)mat < this->mScene->mNumMaterials; mat._0_4_ = (uint)mat + 1) {
    name.field_2._8_8_ = this->mScene->mMaterials[(uint)mat];
    std::__cxx11::string::string((string *)local_440);
    aVar2 = aiMaterial::Get((aiMaterial *)name.field_2._8_8_,"?mat.name",0,0,
                            (aiString *)((long)&mat + 4));
    if (aVar2 == aiReturn_SUCCESS) {
      pcVar3 = aiString::C_Str((aiString *)((long)&mat + 4));
      std::__cxx11::string::operator=((string *)local_440,pcVar3);
    }
    peVar4 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    glTF::Asset::FindUniqueID((string *)&m.index,peVar4,(string *)local_440,"material");
    std::__cxx11::string::operator=((string *)local_440,(string *)&m.index);
    std::__cxx11::string::~string((string *)&m.index);
    peVar4 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar6 = glTF::LazyDict<glTF::Material>::Create(&peVar4->materials,(string *)local_440);
    uVar1 = name.field_2._8_8_;
    local_480 = (undefined1  [8])RVar6.vector;
    m.vector._0_4_ = RVar6.index;
    pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
    GetMatColorOrTex(this,(aiMaterial *)uVar1,&pMVar5->ambient,"$clr.ambient",0,0,
                     aiTextureType_AMBIENT);
    uVar1 = name.field_2._8_8_;
    pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
    GetMatColorOrTex(this,(aiMaterial *)uVar1,&pMVar5->diffuse,"$clr.diffuse",0,0,
                     aiTextureType_DIFFUSE);
    uVar1 = name.field_2._8_8_;
    pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
    GetMatColorOrTex(this,(aiMaterial *)uVar1,&pMVar5->specular,"$clr.specular",0,0,
                     aiTextureType_SPECULAR);
    uVar1 = name.field_2._8_8_;
    pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
    GetMatColorOrTex(this,(aiMaterial *)uVar1,&pMVar5->emission,"$clr.emissive",0,0,
                     aiTextureType_EMISSIVE);
    uVar1 = name.field_2._8_8_;
    pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
    aVar2 = aiMaterial::Get((aiMaterial *)uVar1,"$mat.opacity",0,0,&pMVar5->transparency);
    local_51d = false;
    if (aVar2 == aiReturn_SUCCESS) {
      pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
      local_51d = pMVar5->transparency != 1.0;
    }
    pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
    uVar1 = name.field_2._8_8_;
    pMVar5->transparent = local_51d;
    pMVar5 = glTF::Ref<glTF::Material>::operator->((Ref<glTF::Material> *)local_480);
    anon_unknown.dwarf_206f26::GetMatScalar
              ((aiMaterial *)uVar1,&pMVar5->shininess,"$mat.shininess",0,0);
    std::__cxx11::string::~string((string *)local_440);
  }
  return;
}

Assistant:

void glTFExporter::ExportMaterials()
{
    aiString aiName;
    for (unsigned int i = 0; i < mScene->mNumMaterials; ++i) {
        const aiMaterial* mat = mScene->mMaterials[i];


        std::string name;
        if (mat->Get(AI_MATKEY_NAME, aiName) == AI_SUCCESS) {
            name = aiName.C_Str();
        }
        name = mAsset->FindUniqueID(name, "material");

        Ref<Material> m = mAsset->materials.Create(name);

        GetMatColorOrTex(mat, m->ambient, AI_MATKEY_COLOR_AMBIENT, aiTextureType_AMBIENT);
        GetMatColorOrTex(mat, m->diffuse, AI_MATKEY_COLOR_DIFFUSE, aiTextureType_DIFFUSE);
        GetMatColorOrTex(mat, m->specular, AI_MATKEY_COLOR_SPECULAR, aiTextureType_SPECULAR);
        GetMatColorOrTex(mat, m->emission, AI_MATKEY_COLOR_EMISSIVE, aiTextureType_EMISSIVE);

        m->transparent = mat->Get(AI_MATKEY_OPACITY, m->transparency) == aiReturn_SUCCESS && m->transparency != 1.0;

        GetMatScalar(mat, m->shininess, AI_MATKEY_SHININESS);
    }
}